

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::DescribeCallCountTo(ExpectationBase *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  char *pcVar3;
  ExpectationBase *in_RDI;
  MutexBase *unaff_retaddr;
  ostream *in_stack_00000008;
  int in_stack_00000014;
  ostream *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ExpectationBase *local_28;
  
  MutexBase::AssertHeld(unaff_retaddr);
  std::operator<<(in_RSI,"         Expected: to be ");
  cardinality(in_RDI);
  Cardinality::DescribeTo((Cardinality *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::operator<<(in_RSI,"\n           Actual: ");
  call_count((ExpectationBase *)in_stack_ffffffffffffffd0);
  Cardinality::DescribeActualCallCountTo(in_stack_00000014,in_stack_00000008);
  poVar2 = std::operator<<(in_RSI," - ");
  bVar1 = IsOverSaturated((ExpectationBase *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_28 = (ExpectationBase *)0x118c0a9;
  }
  else {
    bVar1 = IsSaturated((ExpectationBase *)in_stack_ffffffffffffffd0);
    if (bVar1) {
      in_stack_ffffffffffffffd0 = "saturated";
      local_28 = (ExpectationBase *)in_stack_ffffffffffffffd0;
    }
    else {
      bVar1 = IsSatisfied((ExpectationBase *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0 = "unsatisfied";
      local_28 = (ExpectationBase *)in_stack_ffffffffffffffd0;
      if (bVar1) {
        in_stack_ffffffffffffffd0 = "satisfied";
        local_28 = (ExpectationBase *)in_stack_ffffffffffffffd0;
      }
    }
  }
  poVar2 = std::operator<<(poVar2,(char *)local_28);
  poVar2 = std::operator<<(poVar2," and ");
  bVar1 = is_retired((ExpectationBase *)in_stack_ffffffffffffffd0);
  pcVar3 = "active";
  if (bVar1) {
    pcVar3 = "retired";
  }
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();

  // Describes how many times the function is expected to be called.
  *os << "         Expected: to be ";
  cardinality().DescribeTo(os);
  *os << "\n           Actual: ";
  Cardinality::DescribeActualCallCountTo(call_count(), os);

  // Describes the state of the expectation (e.g. is it satisfied?
  // is it active?).
  *os << " - "
      << (IsOverSaturated() ? "over-saturated"
          : IsSaturated()   ? "saturated"
          : IsSatisfied()   ? "satisfied"
                            : "unsatisfied")
      << " and " << (is_retired() ? "retired" : "active");
}